

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Publications.cpp
# Opt level: O2

void __thiscall helics::Publication::publishDefV(Publication *this,defV *val)

{
  ValueFederate *pVVar1;
  bool bVar2;
  SmallBuffer db;
  data_view local_a0;
  SmallBuffer local_80;
  
  pVVar1 = this->fed;
  if (this->changeDetectionEnabled == true) {
    bVar2 = std::operator!=(&this->prevValue,val);
    if (!bVar2) {
      return;
    }
    std::__detail::__variant::
    _Copy_assign_base<false,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
    ::operator=((_Copy_assign_base<false,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                 *)&this->prevValue,
                (_Copy_assign_base<false,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                 *)val);
  }
  if (pVVar1 != (ValueFederate *)0x0) {
    typeConvertDefV(&local_80,this->pubType,val);
    local_a0.dblock._M_len = local_80.bufferSize;
    local_a0.dblock._M_str = (char *)local_80.heap;
    local_a0.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_a0.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    helics::ValueFederate::publishBytes(this->fed,this,&local_a0);
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_a0.ref.
                super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    SmallBuffer::~SmallBuffer(&local_80);
  }
  return;
}

Assistant:

void Publication::publishDefV(const defV& val)
{
    bool doPublish = (fed != nullptr);
    if (changeDetectionEnabled) {
        if (prevValue != val) {
            prevValue = val;
        } else {
            doPublish = false;
        }
    }
    if (doPublish) {
        auto db = typeConvertDefV(pubType, val);
        fed->publishBytes(*this, db);
    }
}